

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O1

bool __thiscall
Rml::Element::StartTransition
          (Element *this,Transition *transition,Property *start_value,Property *target_value)

{
  PropertyId PVar1;
  pointer pEVar2;
  pointer pEVar3;
  bool bVar4;
  pointer pEVar5;
  long lVar6;
  iterator __position;
  float fVar7;
  double dVar8;
  float local_9c;
  ElementAnimation local_88;
  vector<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_> local_48;
  
  pEVar2 = (this->animations).
           super__Vector_base<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>._M_impl
           .super__Vector_impl_data._M_start;
  pEVar3 = (this->animations).
           super__Vector_base<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>._M_impl
           .super__Vector_impl_data._M_finish;
  lVar6 = (long)pEVar3 - (long)pEVar2 >> 8;
  pEVar5 = pEVar2;
  if (0 < lVar6) {
    PVar1 = transition->id;
    pEVar5 = (pointer)(&pEVar2->property_id + ((long)pEVar3 - (long)pEVar2 & 0xffffffffffffff00));
    lVar6 = lVar6 + 1;
    __position._M_current = pEVar2 + 2;
    do {
      if (__position._M_current[-2].property_id == PVar1) {
        __position._M_current = __position._M_current + -2;
        goto LAB_0021f5d7;
      }
      if (__position._M_current[-1].property_id == PVar1) {
        __position._M_current = __position._M_current + -1;
        goto LAB_0021f5d7;
      }
      if ((__position._M_current)->property_id == PVar1) goto LAB_0021f5d7;
      if (__position._M_current[1].property_id == PVar1) {
        __position._M_current = __position._M_current + 1;
        goto LAB_0021f5d7;
      }
      lVar6 = lVar6 + -1;
      __position._M_current = __position._M_current + 4;
    } while (1 < lVar6);
  }
  lVar6 = (long)pEVar3 - (long)pEVar5 >> 6;
  if (lVar6 != 1) {
    if (lVar6 != 2) {
      __position._M_current = pEVar3;
      if ((lVar6 != 3) || (__position._M_current = pEVar5, pEVar5->property_id == transition->id))
      goto LAB_0021f5d7;
      pEVar5 = pEVar5 + 1;
    }
    __position._M_current = pEVar5;
    if (pEVar5->property_id == transition->id) goto LAB_0021f5d7;
    pEVar5 = pEVar5 + 1;
  }
  __position._M_current = pEVar5;
  if (pEVar5->property_id != transition->id) {
    __position._M_current = pEVar3;
  }
LAB_0021f5d7:
  if ((__position._M_current == pEVar3) || ((__position._M_current)->origin == Transition)) {
    local_9c = transition->duration;
    dVar8 = Clock::GetElapsedTime();
    dVar8 = (double)transition->delay + dVar8;
    if (__position._M_current ==
        (this->animations).
        super__Vector_base<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      ElementAnimation::ElementAnimation
                (&local_88,transition->id,Transition,start_value,this,dVar8,0.0,1,false);
      ::std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>::
      emplace_back<Rml::ElementAnimation>(&this->animations,&local_88);
      ::std::vector<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>::~vector(&local_88.keys);
      __position._M_current =
           (this->animations).
           super__Vector_base<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>._M_impl
           .super__Vector_impl_data._M_finish + -1;
    }
    else {
      fVar7 = ElementAnimation::GetInterpolationFactorAndKeys
                        (__position._M_current,(int *)0x0,(int *)0x0);
      local_9c = local_9c * (1.0 - (1.0 - fVar7) * transition->reverse_adjustment_factor);
      ElementAnimation::ElementAnimation
                (&local_88,transition->id,Transition,start_value,this,dVar8,0.0,1,false);
      *(ulong *)((long)&(__position._M_current)->duration + 1) =
           CONCAT53(local_88._8_5_,local_88.duration._1_3_);
      (__position._M_current)->property_id = local_88.property_id;
      *(int3 *)&(__position._M_current)->field_0x1 = local_88._1_3_;
      (__position._M_current)->duration =
           (float)(int)(CONCAT35(local_88.duration._1_3_,local_88._0_5_) >> 0x20);
      local_48.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
      super__Vector_impl_data._M_start =
           ((__position._M_current)->keys).
           super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_48.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
      super__Vector_impl_data._M_finish =
           ((__position._M_current)->keys).
           super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_48.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           ((__position._M_current)->keys).
           super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      ((__position._M_current)->keys).
      super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_88.keys.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
           _M_impl.super__Vector_impl_data._M_start;
      ((__position._M_current)->keys).
      super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_88.keys.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      ((__position._M_current)->keys).
      super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_88.keys.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_88.keys.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.keys.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.keys.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::std::vector<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>::~vector(&local_48);
      *(undefined4 *)((long)&(__position._M_current)->current_iteration + 3) = local_88._55_4_;
      (__position._M_current)->last_update_world_time = local_88.last_update_world_time;
      (__position._M_current)->time_since_iteration_start =
           (float)local_88.time_since_iteration_start;
      (__position._M_current)->current_iteration =
           (int)(CONCAT17(local_88.current_iteration._3_1_,local_88._48_7_) >> 0x20);
      ::std::vector<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>::~vector(&local_88.keys);
    }
    bVar4 = ElementAnimation::AddKey
                      (__position._M_current,local_9c,target_value,this,transition->tween,true);
    if (bVar4) {
      ElementStyle::SetProperty(&this->meta->style,transition->id,start_value);
    }
    else {
      ::std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>::_M_erase
                (&this->animations,__position);
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool Element::StartTransition(const Transition& transition, const Property& start_value, const Property& target_value)
{
	auto it = std::find_if(animations.begin(), animations.end(), [&](const ElementAnimation& el) { return el.GetPropertyId() == transition.id; });

	if (it != animations.end() && !it->IsTransition())
		return false;

	float duration = transition.duration;
	double start_time = Clock::GetElapsedTime() + (double)transition.delay;

	if (it == animations.end())
	{
		// Add transition as new animation
		animations.push_back(ElementAnimation{transition.id, ElementAnimationOrigin::Transition, start_value, *this, start_time, 0.0f, 1, false});
		it = (animations.end() - 1);
	}
	else
	{
		// Compress the duration based on the progress of the current animation
		float f = it->GetInterpolationFactor();
		f = 1.0f - (1.0f - f) * transition.reverse_adjustment_factor;
		duration = duration * f;
		// Replace old transition
		*it = ElementAnimation{transition.id, ElementAnimationOrigin::Transition, start_value, *this, start_time, 0.0f, 1, false};
	}

	bool result = it->AddKey(duration, target_value, *this, transition.tween, true);

	if (result)
		SetProperty(transition.id, start_value);
	else
		animations.erase(it);

	return result;
}